

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O3

char get_next_file(int imageno,dircnt_t *dirptr,img_fol_t *img_fol,
                  opj_decompress_parameters *parameters)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  char cVar4;
  ulong uVar5;
  char infilename [4096];
  char temp_ofname [4096];
  char outfilename [4096];
  char temp1 [4096];
  char image_filename [4096];
  char local_5038;
  char acStack_5037 [4095];
  char local_4038 [4096];
  char local_3038;
  char acStack_3037 [4095];
  char local_2038 [4096];
  char local_1038 [4104];
  
  memset(local_2038,0,0x1000);
  strcpy(local_1038,dirptr->filename[imageno]);
  fprintf(_stderr,"File Number %d \"%s\"\n",imageno,local_1038);
  sprintf(&local_5038,"%s%s%s",img_fol->imgdirpath,path_separator,local_1038);
  iVar1 = infile_format(&local_5038);
  parameters->decod_format = iVar1;
  cVar4 = '\x01';
  if (iVar1 != -1) {
    if (local_5038 == '\0') {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      do {
        uVar3 = uVar5;
        uVar5 = uVar3 + 1;
        if (acStack_5037[uVar3] == '\0') break;
      } while (uVar3 < 0xfff);
      if (0xffe < uVar3) {
        return '\x01';
      }
    }
    memcpy(parameters->infile,&local_5038,uVar5);
    parameters->infile[uVar5] = '\0';
    pcVar2 = strtok(local_1038,".");
    strcpy(local_4038,pcVar2);
    pcVar2 = strtok((char *)0x0,".");
    if (pcVar2 != (char *)0x0) {
      do {
        strcat(local_4038,local_2038);
        sprintf(local_2038,".%s",pcVar2);
        pcVar2 = strtok((char *)0x0,".");
      } while (pcVar2 != (char *)0x0);
    }
    if (img_fol->set_out_format == '\x01') {
      uVar5 = 0;
      sprintf(&local_3038,"%s/%s.%s",img_fol->imgdirpath,local_4038,img_fol->out_format);
      if (local_3038 != '\0') {
        uVar5 = 0;
        do {
          uVar3 = uVar5;
          uVar5 = uVar3 + 1;
          if (acStack_3037[uVar3] == '\0') break;
        } while (uVar3 < 0xfff);
        if (0xffe < uVar3) {
          return '\x01';
        }
      }
      memcpy(parameters->outfile,&local_3038,uVar5);
      parameters->outfile[uVar5] = '\0';
    }
    cVar4 = '\0';
  }
  return cVar4;
}

Assistant:

char get_next_file(int imageno, dircnt_t *dirptr, img_fol_t *img_fol,
                   opj_decompress_parameters *parameters)
{
    char image_filename[OPJ_PATH_LEN], infilename[OPJ_PATH_LEN],
         outfilename[OPJ_PATH_LEN], temp_ofname[OPJ_PATH_LEN];
    char *temp_p, temp1[OPJ_PATH_LEN] = "";

    strcpy(image_filename, dirptr->filename[imageno]);
    fprintf(stderr, "File Number %d \"%s\"\n", imageno, image_filename);
    sprintf(infilename, "%s%s%s", img_fol->imgdirpath, path_separator,
            image_filename);
    parameters->decod_format = infile_format(infilename);
    if (parameters->decod_format == -1) {
        return 1;
    }
    if (opj_strcpy_s(parameters->infile, sizeof(parameters->infile),
                     infilename) != 0) {
        return 1;
    }

    /*Set output file*/
    strcpy(temp_ofname, strtok(image_filename, "."));
    while ((temp_p = strtok(NULL, ".")) != NULL) {
        strcat(temp_ofname, temp1);
        sprintf(temp1, ".%s", temp_p);
    }
    if (img_fol->set_out_format == 1) {
        sprintf(outfilename, "%s/%s.%s", img_fol->imgdirpath, temp_ofname,
                img_fol->out_format);
        if (opj_strcpy_s(parameters->outfile, sizeof(parameters->outfile),
                         outfilename) != 0) {
            return 1;
        }
    }
    return 0;
}